

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

int main(void)

{
  test_impl *p;
  ptr_type *ppVar1;
  ostream *poVar2;
  consumer test_consumer;
  injected<consumer> i_consumer;
  string local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_38;
  shared_count local_30;
  undefined1 local_28 [16];
  
  inject::context<0>::get_current();
  inject::context<0>::instance<consumer>((context<0> *)local_28);
  p = (test_impl *)operator_new(8);
  (p->super_service)._vptr_service = (_func_int **)&PTR_name_abi_cxx11__0010f730;
  boost::shared_ptr<service>::shared_ptr<test_impl>((shared_ptr<service> *)&local_58,p);
  local_38 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)local_58._M_dataplus._M_p;
  local_30.pi_ = (sp_counted_base *)local_58._M_string_length;
  if ((sp_counted_base *)local_58._M_string_length != (sp_counted_base *)0x0) {
    LOCK();
    *(uint_least32_t *)(local_58._M_string_length + 8) =
         *(uint_least32_t *)(local_58._M_string_length + 8) + 1;
    UNLOCK();
  }
  boost::detail::shared_count::~shared_count((shared_count *)&local_58._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"with injected struct service name is \'",0x26);
  ppVar1 = inject::context<0>::injected<consumer>::ptr((injected<consumer> *)local_28);
  consumer::service_name_abi_cxx11_(&local_58,ppVar1->px);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,local_58._M_dataplus._M_p,local_58._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\'",1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"with test struct service name is \'",0x22);
  if (local_38 !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    (*(code *)**(undefined8 **)local_38)(&local_58);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,local_58._M_dataplus._M_p,local_58._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\'",1);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    }
    boost::detail::shared_count::~shared_count(&local_30);
    boost::detail::shared_count::~shared_count((shared_count *)(local_28 + 8));
    return 0;
  }
  __assert_fail("px != 0","/usr/include/boost/smart_ptr/shared_ptr.hpp",0x2d8,
                "typename boost::detail::sp_member_access<T>::type boost::shared_ptr<service>::operator->() const [T = service]"
               );
}

Assistant:

int main() {

    // request an instance with injected service
    context<>::injected<consumer> i_consumer;

    // manually create an instance with test service
    consumer test_consumer(
        consumer::service_ptr(new test_impl()));

    cout << "with injected struct service name is '" <<
        i_consumer->service_name() << "'" << endl;
    
    cout << "with test struct service name is '" <<
        test_consumer.service_name() << "'" << endl;

    return 0;
}